

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void sendHelpToSlack(string *CHANNEL_NAME)

{
  allocator local_139;
  string local_138;
  string local_118;
  allocator local_f1;
  string local_f0;
  string local_d0;
  allocator local_a9;
  string local_a8;
  string local_88;
  allocator local_51;
  string local_50;
  string local_30;
  string *local_10;
  string *CHANNEL_NAME_local;
  
  local_10 = CHANNEL_NAME;
  std::__cxx11::string::string((string *)&local_30,(string *)CHANNEL_NAME);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Here are a list of valid commands",&local_51);
  sendMessageToSlack(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_88,(string *)CHANNEL_NAME);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"`@kubernetesbot get nodes` show\'s information about nodes",
             &local_a9);
  sendMessageToSlack(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_d0,(string *)CHANNEL_NAME);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,"`@kubernetesbot get pods`   shows information about pods",
             &local_f1);
  sendMessageToSlack(&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_118,(string *)CHANNEL_NAME);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"`@kubernetesbot help`   displays valid commands",&local_139);
  sendMessageToSlack(&local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_118);
  return;
}

Assistant:

void sendHelpToSlack(string CHANNEL_NAME) {
    sendMessageToSlack(CHANNEL_NAME, "Here are a list of valid commands");
    sendMessageToSlack(CHANNEL_NAME, "`@kubernetesbot get nodes` show's information about nodes");
    sendMessageToSlack(CHANNEL_NAME, "`@kubernetesbot get pods`   shows information about pods");
    sendMessageToSlack(CHANNEL_NAME, "`@kubernetesbot help`   displays valid commands");
}